

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_if_statement(Parser *this)

{
  Symbol_Table *this_00;
  string *__rhs;
  bool bVar1;
  int label_number;
  int iVar2;
  ostream *poVar3;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  poVar3 = std::operator<<((ostream *)this->out_file,"\t\t\t<if_statement>");
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = &this->symbol_table;
  label_number = Symbol_Table::get_label_count(this_00);
  VM_Writer::write_if(this->vm_writer,label_number);
  Symbol_Table::increment_label_count(this_00);
  Symbol_Table::increment_label_count(this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"(",&local_71);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"if statement",&local_72);
  check_expected_x_after_y(this,&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  poVar3 = (ostream *)this->out_file;
  __rhs = &this->cur_token;
  std::operator+(&local_50,"\t\t\t\t<symbol>",__rhs);
  std::operator+(&local_70,&local_50,"</symbol>");
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  query_tokenizer(this);
  parse_expression(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,")",&local_71);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"expression",&local_72);
  check_expected_x_after_y(this,&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  poVar3 = (ostream *)this->out_file;
  std::operator+(&local_50,"\t\t\t\t<symbol>",__rhs);
  std::operator+(&local_70,&local_50,"</symbol>");
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  query_tokenizer(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"{",&local_71);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,")",&local_72);
  check_expected_x_after_y(this,&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  poVar3 = (ostream *)this->out_file;
  std::operator+(&local_50,"\t\t\t\t<symbol>",__rhs);
  std::operator+(&local_70,&local_50,"</symbol>");
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  query_tokenizer(this);
  parse_statements(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"}",&local_71);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"statements",&local_72);
  check_expected_x_after_y(this,&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  poVar3 = (ostream *)this->out_file;
  std::operator+(&local_50,"\t\t\t\t<symbol>",__rhs);
  std::operator+(&local_70,&local_50,"</symbol>");
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  query_tokenizer(this);
  bVar1 = std::operator==(__rhs,"else");
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)this->out_file,"\t\t\t<else_statement>");
    std::endl<char,std::char_traits<char>>(poVar3);
    VM_Writer::write_label(this->vm_writer,label_number);
    query_tokenizer(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"{",&local_71);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"else statement",&local_72);
    check_expected_x_after_y(this,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    poVar3 = (ostream *)this->out_file;
    std::operator+(&local_50,"\t\t\t\t<symbol>",__rhs);
    std::operator+(&local_70,&local_50,"</symbol>");
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    query_tokenizer(this);
    iVar2 = Tokenizer::get_keyword_val(this->tokenizer,__rhs);
    if (iVar2 < 9) {
      iVar2 = Tokenizer::get_keyword_val(this->tokenizer,__rhs);
      if (0xe < iVar2) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Expected a statement after {");
        std::endl<char,std::char_traits<char>>(poVar3);
        exit(0);
      }
    }
    parse_statements(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"}",&local_71);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"statements",&local_72);
    check_expected_x_after_y(this,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    poVar3 = (ostream *)this->out_file;
    std::operator+(&local_50,"\t\t\t\t<symbol>",__rhs);
    std::operator+(&local_70,&local_50,"</symbol>");
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    std::endl<char,std::char_traits<char>>(poVar3);
    label_number = label_number + 1;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    VM_Writer::write_goto(this->vm_writer,label_number);
    Symbol_Table::increment_label_count(this_00);
    query_tokenizer(this);
  }
  VM_Writer::write_label(this->vm_writer,label_number);
  poVar3 = std::operator<<((ostream *)this->out_file,"\t\t\t</if_statement>");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void Parser::parse_if_statement() {
    out_file << "\t\t\t<if_statement>" << std::endl;

    int label_count = symbol_table.get_label_count();
    vm_writer.write_if(label_count);
    // reserve two labels for each potential if-else pair
    symbol_table.increment_label_count();
    symbol_table.increment_label_count();


    check_expected_x_after_y("(", "if statement");
    out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    query_tokenizer();

    parse_expression();

    check_expected_x_after_y(")", "expression");
    out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    query_tokenizer();

    check_expected_x_after_y("{", ")");
    out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    query_tokenizer();

    parse_statements();

    check_expected_x_after_y("}", "statements");
    out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    query_tokenizer();

    if (cur_token == "else") {
        out_file << "\t\t\t<else_statement>" << std::endl;
        vm_writer.write_label(label_count);
        label_count++;
        query_tokenizer();

        check_expected_x_after_y("{", "else statement");
        out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
        query_tokenizer();

        if (tokenizer.get_keyword_val(cur_token) < LET && tokenizer.get_keyword_val(cur_token) > DO) {
            std::cerr << "Expected a statement after {" << std::endl;
            exit(0);
        }
        parse_statements();

        check_expected_x_after_y("}", "statements");
        out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
        vm_writer.write_goto(label_count);

        // increment for the next (potential) if statement
        symbol_table.increment_label_count();
        query_tokenizer();
    }

    vm_writer.write_label(label_count);
    out_file << "\t\t\t</if_statement>" << std::endl;
}